

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O3

int dlep_session_generate_signal_status
              (dlep_session *session,int32_t signal,oonf_layer2_neigh_key *neighbor,
              dlep_status status,char *msg)

{
  int iVar1;
  undefined8 uVar2;
  ulong uVar3;
  char *pcVar4;
  
  iVar1 = _generate_signal(session,signal,neighbor);
  if (iVar1 == 0) {
    iVar1 = dlep_writer_add_status(&session->writer,status,msg);
    uVar3 = (ulong)session->log_source;
    if (iVar1 == 0) {
      iVar1 = dlep_writer_finish_signal(&session->writer,session->log_source);
      return iVar1;
    }
    if (((&log_global_mask)[uVar3] & 4) == 0) {
      return -1;
    }
    pcVar4 = "Could not add status TLV";
    uVar2 = 0x28f;
  }
  else {
    uVar3 = (ulong)session->log_source;
    if (((&log_global_mask)[uVar3] & 4) == 0) {
      return -1;
    }
    pcVar4 = "Could not generate signal %u";
    uVar2 = 0x28b;
  }
  oonf_log(4,uVar3,"src/generic/dlep/dlep_session.c",uVar2,0,0,pcVar4);
  return -1;
}

Assistant:

int
dlep_session_generate_signal_status(struct dlep_session *session, int32_t signal, const struct oonf_layer2_neigh_key *neighbor,
  enum dlep_status status, const char *msg) {
  if (_generate_signal(session, signal, neighbor)) {
    OONF_WARN(session->log_source, "Could not generate signal %u", signal);
    return -1;
  }
  if (dlep_writer_add_status(&session->writer, status, msg)) {
    OONF_WARN(session->log_source, "Could not add status TLV");
    return -1;
  }
  return dlep_writer_finish_signal(&session->writer, session->log_source);
}